

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersector1<8,_16777232,_false,_embree::avx512::ArrayIntersector1<embree::avx512::InstanceIntersector1MB>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined8 uVar5;
  AABBNodeMB4D *node1;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  InstancePrimitive *prim;
  ulong uVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  float fVar20;
  float fVar21;
  undefined1 auVar22 [32];
  undefined4 uVar23;
  undefined8 uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [64];
  undefined1 auVar27 [32];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [32];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  Precalculations pre;
  NodeRef stack [564];
  Precalculations local_1301;
  Ray *local_1300;
  ulong local_12f8;
  ulong *local_12f0;
  RayQueryContext *local_12e8;
  long local_12e0;
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  ulong local_11d8;
  ulong local_11d0 [564];
  
  local_11d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8 != 8) {
    fVar1 = ray->tfar;
    if (0.0 <= fVar1) {
      aVar2 = (ray->dir).field_0.field_1;
      auVar3 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar16._8_4_ = 0x7fffffff;
      auVar16._0_8_ = 0x7fffffff7fffffff;
      auVar16._12_4_ = 0x7fffffff;
      auVar16 = vandps_avx512vl((undefined1  [16])aVar2,auVar16);
      auVar25._8_4_ = 0x219392ef;
      auVar25._0_8_ = 0x219392ef219392ef;
      auVar25._12_4_ = 0x219392ef;
      local_12f0 = local_11d0;
      uVar13 = vcmpps_avx512vl(auVar16,auVar25,1);
      bVar15 = (bool)((byte)uVar13 & 1);
      auVar17._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * (int)aVar2.x;
      bVar15 = (bool)((byte)(uVar13 >> 1) & 1);
      auVar17._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * (int)aVar2.y;
      bVar15 = (bool)((byte)(uVar13 >> 2) & 1);
      auVar17._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * (int)aVar2.z;
      bVar15 = (bool)((byte)(uVar13 >> 3) & 1);
      auVar17._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * aVar2.field_3.a;
      auVar16 = vrcp14ps_avx512vl(auVar17);
      auVar18._8_4_ = 0x3f800000;
      auVar18._0_8_ = 0x3f8000003f800000;
      auVar18._12_4_ = 0x3f800000;
      auVar18 = vfnmadd213ps_avx512vl(auVar17,auVar16,auVar18);
      auVar17 = vfmadd132ps_fma(auVar18,auVar16,auVar16);
      fVar20 = auVar17._0_4_;
      local_11f8._4_4_ = fVar20;
      local_11f8._0_4_ = fVar20;
      local_11f8._8_4_ = fVar20;
      local_11f8._12_4_ = fVar20;
      local_11f8._16_4_ = fVar20;
      local_11f8._20_4_ = fVar20;
      local_11f8._24_4_ = fVar20;
      local_11f8._28_4_ = fVar20;
      auVar32 = ZEXT3264(local_11f8);
      auVar16 = vmovshdup_avx(auVar17);
      uVar24 = auVar16._0_8_;
      local_1218._8_8_ = uVar24;
      local_1218._0_8_ = uVar24;
      local_1218._16_8_ = uVar24;
      local_1218._24_8_ = uVar24;
      auVar33 = ZEXT3264(local_1218);
      auVar18 = vshufpd_avx(auVar17,auVar17,1);
      auVar27._8_4_ = 2;
      auVar27._0_8_ = 0x200000002;
      auVar27._12_4_ = 2;
      auVar27._16_4_ = 2;
      auVar27._20_4_ = 2;
      auVar27._24_4_ = 2;
      auVar27._28_4_ = 2;
      local_1238 = vpermps_avx2(auVar27,ZEXT1632(auVar17));
      auVar34 = ZEXT3264(local_1238);
      fVar21 = fVar20 * (ray->org).field_0.m128[0];
      auVar30._8_4_ = 1;
      auVar30._0_8_ = 0x100000001;
      auVar30._12_4_ = 1;
      auVar30._16_4_ = 1;
      auVar30._20_4_ = 1;
      auVar30._24_4_ = 1;
      auVar30._28_4_ = 1;
      auVar22 = ZEXT1632(CONCAT412(auVar17._12_4_ * (ray->org).field_0.m128[3],
                                   CONCAT48(auVar17._8_4_ * (ray->org).field_0.m128[2],
                                            CONCAT44(auVar17._4_4_ * (ray->org).field_0.m128[1],
                                                     fVar21))));
      auVar30 = vpermps_avx2(auVar30,auVar22);
      auVar22 = vpermps_avx2(auVar27,auVar22);
      local_12f8 = (ulong)(fVar20 < 0.0) << 5;
      uVar11 = (ulong)(auVar16._0_4_ < 0.0) << 5 | 0x40;
      uVar14 = (ulong)(auVar18._0_4_ < 0.0) << 5 | 0x80;
      uVar12 = local_12f8 ^ 0x20;
      uVar23 = auVar3._0_4_;
      local_1258._4_4_ = uVar23;
      local_1258._0_4_ = uVar23;
      local_1258._8_4_ = uVar23;
      local_1258._12_4_ = uVar23;
      local_1258._16_4_ = uVar23;
      local_1258._20_4_ = uVar23;
      local_1258._24_4_ = uVar23;
      local_1258._28_4_ = uVar23;
      auVar26 = ZEXT3264(local_1258);
      local_1278._4_4_ = fVar1;
      local_1278._0_4_ = fVar1;
      local_1278._8_4_ = fVar1;
      local_1278._12_4_ = fVar1;
      local_1278._16_4_ = fVar1;
      local_1278._20_4_ = fVar1;
      local_1278._24_4_ = fVar1;
      local_1278._28_4_ = fVar1;
      auVar28 = ZEXT3264(local_1278);
      local_1298._0_8_ = CONCAT44(fVar21,fVar21) ^ 0x8000000080000000;
      local_1298._8_4_ = -fVar21;
      local_1298._12_4_ = -fVar21;
      local_1298._16_4_ = -fVar21;
      local_1298._20_4_ = -fVar21;
      local_1298._24_4_ = -fVar21;
      local_1298._28_4_ = -fVar21;
      auVar29 = ZEXT3264(local_1298);
      local_12b8._0_8_ = auVar30._0_8_ ^ 0x8000000080000000;
      local_12b8._8_4_ = auVar30._8_4_ ^ 0x80000000;
      local_12b8._12_4_ = auVar30._12_4_ ^ 0x80000000;
      local_12b8._16_4_ = auVar30._16_4_ ^ 0x80000000;
      local_12b8._20_4_ = auVar30._20_4_ ^ 0x80000000;
      local_12b8._24_4_ = auVar30._24_4_ ^ 0x80000000;
      local_12b8._28_4_ = auVar30._28_4_ ^ 0x80000000;
      auVar31 = ZEXT3264(local_12b8);
      local_12d8._0_8_ = auVar22._0_8_ ^ 0x8000000080000000;
      local_12d8._8_4_ = auVar22._8_4_ ^ 0x80000000;
      local_12d8._12_4_ = auVar22._12_4_ ^ 0x80000000;
      local_12d8._16_4_ = auVar22._16_4_ ^ 0x80000000;
      local_12d8._20_4_ = auVar22._20_4_ ^ 0x80000000;
      local_12d8._24_4_ = auVar22._24_4_ ^ 0x80000000;
      local_12d8._28_4_ = auVar22._28_4_ ^ 0x80000000;
      auVar35 = ZEXT3264(local_12d8);
      uVar13 = local_12f8;
      local_1300 = ray;
      local_12e8 = context;
LAB_0069c012:
      do {
        uVar9 = local_12f0[-1];
        local_12f0 = local_12f0 + -1;
        while ((uVar9 & 8) == 0) {
          uVar6 = uVar9 & 0xfffffffffffffff0;
          uVar23 = *(undefined4 *)((long)&(ray->dir).field_0 + 0xc);
          auVar19._4_4_ = uVar23;
          auVar19._0_4_ = uVar23;
          auVar19._8_4_ = uVar23;
          auVar19._12_4_ = uVar23;
          auVar19._16_4_ = uVar23;
          auVar19._20_4_ = uVar23;
          auVar19._24_4_ = uVar23;
          auVar19._28_4_ = uVar23;
          auVar3 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar6 + 0x100 + uVar13),auVar19,
                                   *(undefined1 (*) [32])(uVar6 + 0x40 + uVar13));
          auVar3 = vfmadd213ps_fma(ZEXT1632(auVar3),auVar32._0_32_,auVar29._0_32_);
          auVar30 = vmaxps_avx(auVar26._0_32_,ZEXT1632(auVar3));
          auVar3 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar6 + 0x100 + uVar11),auVar19,
                                   *(undefined1 (*) [32])(uVar6 + 0x40 + uVar11));
          auVar16 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar6 + 0x100 + uVar14),auVar19,
                                    *(undefined1 (*) [32])(uVar6 + 0x40 + uVar14));
          auVar3 = vfmadd213ps_fma(ZEXT1632(auVar3),auVar33._0_32_,auVar31._0_32_);
          auVar16 = vfmadd213ps_fma(ZEXT1632(auVar16),auVar34._0_32_,auVar35._0_32_);
          auVar22 = vmaxps_avx(ZEXT1632(auVar3),ZEXT1632(auVar16));
          auVar30 = vmaxps_avx(auVar30,auVar22);
          auVar3 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar6 + 0x100 + uVar12),auVar19,
                                   *(undefined1 (*) [32])(uVar6 + 0x40 + uVar12));
          auVar3 = vfmadd213ps_fma(ZEXT1632(auVar3),auVar32._0_32_,auVar29._0_32_);
          auVar22 = vminps_avx(auVar28._0_32_,ZEXT1632(auVar3));
          auVar3 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar6 + 0x100 + (uVar11 ^ 0x20)),auVar19,
                                   *(undefined1 (*) [32])(uVar6 + 0x40 + (uVar11 ^ 0x20)));
          auVar16 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar6 + 0x100 + (uVar14 ^ 0x20)),auVar19,
                                    *(undefined1 (*) [32])(uVar6 + 0x40 + (uVar14 ^ 0x20)));
          auVar3 = vfmadd213ps_fma(ZEXT1632(auVar3),auVar33._0_32_,auVar31._0_32_);
          auVar16 = vfmadd213ps_fma(ZEXT1632(auVar16),auVar34._0_32_,auVar35._0_32_);
          auVar27 = vminps_avx(ZEXT1632(auVar3),ZEXT1632(auVar16));
          auVar22 = vminps_avx(auVar22,auVar27);
          if (((uint)uVar9 & 7) == 6) {
            uVar24 = vcmpps_avx512vl(auVar30,auVar22,2);
            uVar4 = vcmpps_avx512vl(auVar19,*(undefined1 (*) [32])(uVar6 + 0x1c0),0xd);
            uVar5 = vcmpps_avx512vl(auVar19,*(undefined1 (*) [32])(uVar6 + 0x1e0),1);
            uVar7 = (uint)uVar24 & (uint)uVar4 & (uint)uVar5;
          }
          else {
            uVar24 = vcmpps_avx512vl(auVar30,auVar22,2);
            uVar7 = (uint)uVar24;
          }
          if ((byte)uVar7 == 0) {
            if (local_12f0 == &local_11d8) {
              return;
            }
            goto LAB_0069c012;
          }
          lVar10 = 0;
          for (uVar9 = (ulong)(byte)uVar7; (uVar9 & 1) == 0; uVar9 = uVar9 >> 1 | 0x8000000000000000
              ) {
            lVar10 = lVar10 + 1;
          }
          uVar9 = *(ulong *)(uVar6 + lVar10 * 8);
          uVar7 = (uVar7 & 0xff) - 1 & uVar7 & 0xff;
          uVar8 = (ulong)uVar7;
          if (uVar7 != 0) {
            *local_12f0 = uVar9;
            lVar10 = 0;
            for (; (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x8000000000000000) {
              lVar10 = lVar10 + 1;
            }
            uVar7 = uVar7 - 1 & uVar7;
            uVar8 = (ulong)uVar7;
            bVar15 = uVar7 == 0;
            while( true ) {
              local_12f0 = local_12f0 + 1;
              uVar9 = *(ulong *)(uVar6 + lVar10 * 8);
              if (bVar15) break;
              *local_12f0 = uVar9;
              lVar10 = 0;
              for (uVar9 = uVar8; (uVar9 & 1) == 0; uVar9 = uVar9 >> 1 | 0x8000000000000000) {
                lVar10 = lVar10 + 1;
              }
              uVar8 = uVar8 - 1 & uVar8;
              bVar15 = uVar8 == 0;
            }
          }
        }
        local_12e0 = (ulong)((uint)uVar9 & 0xf) - 8;
        if (local_12e0 != 0) {
          prim = (InstancePrimitive *)(uVar9 & 0xfffffffffffffff0);
          do {
            bVar15 = InstanceIntersector1MB::occluded(&local_1301,ray,local_12e8,prim);
            if (bVar15) {
              local_1300->tfar = -INFINITY;
              return;
            }
            prim = prim + 1;
            local_12e0 = local_12e0 + -1;
            ray = local_1300;
          } while (local_12e0 != 0);
        }
        auVar32 = ZEXT3264(local_11f8);
        auVar33 = ZEXT3264(local_1218);
        auVar34 = ZEXT3264(local_1238);
        auVar26 = ZEXT3264(local_1258);
        auVar28 = ZEXT3264(local_1278);
        auVar29 = ZEXT3264(local_1298);
        auVar31 = ZEXT3264(local_12b8);
        auVar35 = ZEXT3264(local_12d8);
        uVar13 = local_12f8;
      } while (local_12f0 != &local_11d8);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }